

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O3

Var Js::JavascriptOperators::FromPropertyDescriptor
              (PropertyDescriptor *descriptor,ScriptContext *scriptContext)

{
  JavascriptLibrary *pJVar1;
  byte bVar2;
  bool bVar3;
  DynamicObject *pDVar4;
  JavascriptFunction *pJVar5;
  Var pvVar6;
  undefined8 uVar7;
  _func_int **pp_Var8;
  
  pDVar4 = JavascriptLibrary::CreateObject
                     ((scriptContext->super_ScriptContextBase).javascriptLibrary,false,0);
  bVar2 = descriptor->writableSpecified;
  if (descriptor->valueSpecified == false && (Type)bVar2 == false) {
    if (descriptor->setterSpecified == false && descriptor->getterSpecified == false)
    goto LAB_00abbefb;
    pJVar5 = (JavascriptFunction *)PropertyDescriptor::GetGetter(descriptor);
    pJVar1 = (scriptContext->super_ScriptContextBase).javascriptLibrary;
    if ((pJVar5 == (JavascriptFunction *)0x0) ||
       ((pJVar1->super_JavascriptLibraryBase).defaultAccessorFunction.ptr == pJVar5)) {
      pJVar5 = (JavascriptFunction *)(pJVar1->super_JavascriptLibraryBase).undefinedValue.ptr;
    }
    if (pDVar4 != (DynamicObject *)0x0) {
      (*(pDVar4->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
        _vptr_IRecyclerVisitedObject[0x1a])(pDVar4,0x198,pJVar5,0,0);
    }
    pJVar5 = (JavascriptFunction *)PropertyDescriptor::GetSetter(descriptor);
    pJVar1 = (scriptContext->super_ScriptContextBase).javascriptLibrary;
    if ((pJVar5 == (JavascriptFunction *)0x0) ||
       ((pJVar1->super_JavascriptLibraryBase).defaultAccessorFunction.ptr == pJVar5)) {
      pJVar5 = (JavascriptFunction *)(pJVar1->super_JavascriptLibraryBase).undefinedValue.ptr;
    }
    if (pDVar4 == (DynamicObject *)0x0) goto LAB_00abbefb;
    pp_Var8 = (pDVar4->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject;
    uVar7 = 0x19b;
  }
  else {
    if (pDVar4 != (DynamicObject *)0x0 && descriptor->valueSpecified == true) {
      (*(pDVar4->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
        _vptr_IRecyclerVisitedObject[0x1a])(pDVar4,0x197,(descriptor->Value).ptr,0,0);
      bVar2 = descriptor->writableSpecified;
    }
    if ((bVar2 & 1) == 0) goto LAB_00abbefb;
    bVar3 = PropertyDescriptor::IsWritable(descriptor);
    pJVar5 = (JavascriptFunction *)JavascriptBoolean::ToVar((uint)bVar3,scriptContext);
    if (pDVar4 == (DynamicObject *)0x0) goto LAB_00abbefb;
    pp_Var8 = (pDVar4->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject;
    uVar7 = 0x196;
  }
  (*pp_Var8[0x1a])(pDVar4,uVar7,pJVar5,0,0);
LAB_00abbefb:
  if (descriptor->enumerableSpecified == true) {
    bVar3 = PropertyDescriptor::IsEnumerable(descriptor);
    pvVar6 = JavascriptBoolean::ToVar((uint)bVar3,scriptContext);
    if (pDVar4 != (DynamicObject *)0x0) {
      (*(pDVar4->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
        _vptr_IRecyclerVisitedObject[0x1a])(pDVar4,0x194,pvVar6,0,0);
    }
  }
  if (descriptor->configurableSpecified == true) {
    bVar3 = PropertyDescriptor::IsConfigurable(descriptor);
    pvVar6 = JavascriptBoolean::ToVar((uint)bVar3,scriptContext);
    if (pDVar4 != (DynamicObject *)0x0) {
      (*(pDVar4->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
        _vptr_IRecyclerVisitedObject[0x1a])(pDVar4,0x195,pvVar6,0,0);
    }
  }
  return pDVar4;
}

Assistant:

Var JavascriptOperators::FromPropertyDescriptor(const PropertyDescriptor& descriptor, ScriptContext* scriptContext)
    {
        DynamicObject* object = scriptContext->GetLibrary()->CreateObject();

        // ES5 Section 8.10.4 specifies the order for adding these properties.
        if (descriptor.IsDataDescriptor())
        {
            if (descriptor.ValueSpecified())
            {
                JavascriptOperators::InitProperty(object, PropertyIds::value, descriptor.GetValue());
            }
            if (descriptor.WritableSpecified())
            {
                JavascriptOperators::InitProperty(object, PropertyIds::writable, JavascriptBoolean::ToVar(descriptor.IsWritable(), scriptContext));
            }
        }
        else if (descriptor.IsAccessorDescriptor())
        {
            JavascriptOperators::InitProperty(object, PropertyIds::get, JavascriptOperators::CanonicalizeAccessor(descriptor.GetGetter(), scriptContext));
            JavascriptOperators::InitProperty(object, PropertyIds::set, JavascriptOperators::CanonicalizeAccessor(descriptor.GetSetter(), scriptContext));
        }

        if (descriptor.EnumerableSpecified())
        {
            JavascriptOperators::InitProperty(object, PropertyIds::enumerable, JavascriptBoolean::ToVar(descriptor.IsEnumerable(), scriptContext));
        }
        if (descriptor.ConfigurableSpecified())
        {
            JavascriptOperators::InitProperty(object, PropertyIds::configurable, JavascriptBoolean::ToVar(descriptor.IsConfigurable(), scriptContext));
        }
        return object;
    }